

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listener_buffer.c
# Opt level: O1

void ht_listener_buffer_process_serialized_events
               (HT_ListenerBuffer *buffer,TEventPtr events,size_t size,
               HT_ListenerFlushCallback flush_callback,void *listener)

{
  size_t sVar1;
  ulong uVar2;
  ulong __n;
  
  if (size != 0) {
    uVar2 = 0;
    do {
      __n = buffer->max_size - buffer->usage;
      if (size - uVar2 < __n) {
        __n = size - uVar2;
      }
      memcpy(buffer->data + buffer->usage,events + uVar2,__n);
      sVar1 = buffer->usage + __n;
      buffer->usage = sVar1;
      if (sVar1 == buffer->max_size) {
        (*flush_callback)(listener);
        buffer->usage = 0;
      }
      uVar2 = uVar2 + __n;
    } while (uVar2 < size);
  }
  return;
}

Assistant:

void
ht_listener_buffer_process_serialized_events(HT_ListenerBuffer* buffer,
                                             TEventPtr events,
                                             size_t size,
                                             HT_ListenerFlushCallback flush_callback,
                                             void* listener)
{
    size_t written = 0;
    while (written < size)
    {
        size_t actual_size = HT_MIN(size - written, buffer->max_size - buffer->usage);
        memcpy(buffer->data + buffer->usage, events + written, actual_size);
        written += actual_size;
        buffer->usage+= actual_size;

        if (buffer->usage == buffer->max_size)
        {
            flush_callback(listener);
            buffer->usage = 0;
        }
    }
}